

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O0

char * __thiscall
ASDCP::MXF::IndexTableSegment::IndexEntry::EncodeString
          (IndexEntry *this,char *str_buf,ui32_t buf_len)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7d;
  undefined1 local_7b;
  undefined1 local_79;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  char local_68 [2];
  char txt_flags [6];
  char intbuf [64];
  ui32_t buf_len_local;
  char *str_buf_local;
  IndexEntry *this_local;
  
  local_6f = 0x72;
  if ((this->Flags & 0x80) == 0) {
    local_6f = 0x20;
  }
  local_6e = local_6f;
  local_79 = 0x73;
  if ((this->Flags & 0x40) == 0) {
    local_79 = 0x20;
  }
  local_6d = local_79;
  local_7b = 0x66;
  if ((this->Flags & 0x20) == 0) {
    local_7b = 0x20;
  }
  local_6c = local_7b;
  local_7d = 0x62;
  if ((this->Flags & 0x10) == 0) {
    local_7d = 0x20;
  }
  local_6b = local_7d;
  if ((this->Flags & 0xf) == 3) {
    local_7f = 0x42;
  }
  else {
    local_80 = 0x50;
    if ((this->Flags & 0xf) != 2) {
      local_80 = 0x49;
    }
    local_7f = local_80;
  }
  local_6a = local_7f;
  local_69 = 0;
  cVar1 = this->TemporalOffset;
  cVar2 = this->KeyFrameOffset;
  pcVar3 = i64sz(this->StreamOffset,local_68);
  snprintf(str_buf,(ulong)buf_len,"%3i %-3hhu %s %s",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)cVar2
           ,&local_6e,pcVar3);
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::IndexTableSegment::IndexEntry::EncodeString(char* str_buf, ui32_t buf_len) const
{
  char intbuf[IntBufferLen];
  char txt_flags[6];

  txt_flags[0] = ( (Flags & 0x80) != 0 ) ? 'r' : ' ';
  txt_flags[1] = ( (Flags & 0x40) != 0 ) ? 's' : ' ';
  txt_flags[2] = ( (Flags & 0x20) != 0 ) ? 'f' : ' ';
  txt_flags[3] = ( (Flags & 0x10) != 0 ) ? 'b' : ' ';
  txt_flags[4] = ( (Flags & 0x0f) == 3 ) ? 'B' : ( (Flags & 0x0f) == 2 ) ? 'P' : 'I';
  txt_flags[5] = 0;

  snprintf(str_buf, buf_len, "%3i %-3hhu %s %s",
	   TemporalOffset, KeyFrameOffset, txt_flags,
	   i64sz(StreamOffset, intbuf));

  return str_buf;
}